

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

int BIO_gets(BIO *bp,char *buf,int size)

{
  _func_598 *p_Var1;
  int line;
  uint uVar2;
  int reason;
  
  if (((bp == (BIO *)0x0) || (bp->method == (BIO_METHOD *)0x0)) ||
     (p_Var1 = bp->method->bgets, p_Var1 == (_func_598 *)0x0)) {
    reason = 0x73;
    line = 0x66;
  }
  else {
    if (*(int *)&bp->cb_arg != 0) {
      if (size < 1) {
        return 0;
      }
      uVar2 = (*p_Var1)(bp,buf,size);
      if ((int)uVar2 < 1) {
        return uVar2;
      }
      bp->next_bio = (bio_st *)((long)&bp->next_bio->method + (ulong)uVar2);
      return uVar2;
    }
    reason = 0x72;
    line = 0x6a;
  }
  ERR_put_error(0x11,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                ,line);
  return -2;
}

Assistant:

int BIO_gets(BIO *bio, char *buf, int len) {
  if (bio == NULL || bio->method == NULL || bio->method->bgets == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return -2;
  }
  if (!bio->init) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNINITIALIZED);
    return -2;
  }
  if (len <= 0) {
    return 0;
  }
  int ret = bio->method->bgets(bio, buf, len);
  if (ret > 0) {
    bio->num_read += ret;
  }
  return ret;
}